

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces
          (ChElementTetraCorot_4_P *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  double *pdVar10;
  Index IVar11;
  long rows;
  ulong uVar12;
  ActualDstType actualDst;
  Index index;
  ulong uVar13;
  Index size;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  DenseStorage<double,__1,__1,_1,_0> local_38;
  Scalar local_28;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 4) {
    __assert_fail("Fi.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                  ,0x1f1,
                  "virtual void chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_38,4);
  (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[6])(this,&local_38);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols == local_38.m_rows) {
    local_48.m_data = (double *)0x0;
    local_48.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
               (this->StiffnessMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
    rows = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
    if (local_48.m_rows != rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,rows,1);
      rows = local_48.m_rows;
    }
    if (-1 < rows) {
      if (rows != 0) {
        memset(local_48.m_data,0,rows << 3);
      }
      local_28 = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_48,&this->StiffnessMatrix,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_38,&local_28);
      IVar11 = local_48.m_rows;
      if (-1 < local_48.m_rows) {
        pdVar10 = local_48.m_data;
        uVar13 = local_48.m_rows & 0x7ffffffffffffff8;
        if (7 < (ulong)local_48.m_rows) {
          auVar14 = vpbroadcastq_avx512f(ZEXT816(0x8000000000000000));
          uVar12 = 0;
          do {
            auVar15 = vpxorq_avx512f(auVar14,*(undefined1 (*) [64])(local_48.m_data + uVar12));
            auVar15 = vmovdqa64_avx512f(auVar15);
            *(undefined1 (*) [64])(local_48.m_data + uVar12) = auVar15;
            uVar12 = uVar12 + 8;
          } while (uVar12 < uVar13);
        }
        if ((long)uVar13 < local_48.m_rows) {
          auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar15 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          uVar12 = 0;
          auVar16 = vpbroadcastq_avx512f();
          do {
            auVar17 = vpbroadcastq_avx512f();
            auVar17 = vporq_avx512f(auVar17,auVar14);
            uVar9 = vpcmpuq_avx512f(auVar17,auVar16,2);
            pdVar1 = local_48.m_data + uVar13 + uVar12;
            auVar17._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * (long)pdVar1[1];
            auVar17._0_8_ = (ulong)((byte)uVar9 & 1) * (long)*pdVar1;
            auVar17._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * (long)pdVar1[2];
            auVar17._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * (long)pdVar1[3];
            auVar17._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * (long)pdVar1[4];
            auVar17._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * (long)pdVar1[5];
            auVar17._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * (long)pdVar1[6];
            auVar17._56_8_ = (uVar9 >> 7) * (long)pdVar1[7];
            auVar17 = vxorpd_avx512dq(auVar17,auVar15);
            pdVar1 = local_48.m_data + uVar13 + uVar12;
            bVar2 = (bool)((byte)uVar9 & 1);
            bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar9 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar9 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar9 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar2 * auVar17._0_8_ | (ulong)!bVar2 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar3 * auVar17._8_8_ | (ulong)!bVar3 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar4 * auVar17._16_8_ | (ulong)!bVar4 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar5 * auVar17._24_8_ | (ulong)!bVar5 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar6 * auVar17._32_8_ | (ulong)!bVar6 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar7 * auVar17._40_8_ | (ulong)!bVar7 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar8 * auVar17._48_8_ | (ulong)!bVar8 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar9 >> 7) * auVar17._56_8_ |
                                (ulong)!SUB81(uVar9 >> 7,0) * (long)pdVar1[7]);
            uVar12 = uVar12 + 8;
          } while ((((uint)local_48.m_rows & 7) + 7 & 0xfffffff8) != uVar12);
        }
        if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            local_48.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     local_48.m_rows,1);
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != IVar11) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                         );
          }
        }
        pdVar1 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        if (7 < IVar11) {
          uVar12 = 0;
          do {
            auVar14 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar10 + uVar12));
            auVar14 = vmovdqa64_avx512f(auVar14);
            *(undefined1 (*) [64])(pdVar1 + uVar12) = auVar14;
            uVar12 = uVar12 + 8;
          } while (uVar12 < uVar13);
        }
        if ((long)uVar13 < IVar11) {
          do {
            pdVar1[uVar13] = pdVar10[uVar13];
            uVar13 = uVar13 + 1;
          } while (IVar11 != uVar13);
        }
        if (local_48.m_data != (double *)0x0) {
          free((void *)local_48.m_data[-1]);
        }
        if (local_38.m_data != (double *)0x0) {
          free((void *)local_38.m_data[-1]);
        }
        return;
      }
    }
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 4);

    // set up vector of nodal fields
    ChVectorDynamic<> displ(4);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * P
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    //***TO DO*** derivative terms? + [Rlocal] * P_dt ???? ***NO because Poisson  rho dP/dt + div [C] grad P = 0

    FiK_local *= -1.0;

    // ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);  ***corotation NOT NEEDED

    Fi = FiK_local;
}